

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolslib.cpp
# Opt level: O0

int tools_add(lua_State *l)

{
  int iVar1;
  lua_Number lVar2;
  double value;
  double dStack_20;
  int i;
  double sum;
  int paramNum;
  lua_State *l_local;
  
  iVar1 = lua_gettop(l);
  dStack_20 = 0.0;
  for (value._4_4_ = 1; value._4_4_ <= iVar1; value._4_4_ = value._4_4_ + 1) {
    lVar2 = luaL_checknumber(l,value._4_4_);
    dStack_20 = lVar2 + dStack_20;
  }
  lua_pushnumber(l,dStack_20);
  return 1;
}

Assistant:

static int tools_add(lua_State *l) {
    int paramNum = lua_gettop(l);
    double sum = 0;
    for (int i = 1; i <= paramNum; i++) {
        double value = luaL_checknumber(l, i);
        sum += value;
    }
    lua_pushnumber(l, sum);

    return 1;
}